

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O1

bool cmCTestScriptHandler::TryToRemoveBinaryDirectoryOnce(string *directoryPath)

{
  bool bVar1;
  int iVar2;
  Kind KVar3;
  unsigned_long uVar4;
  char *__s;
  ulong dindex;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  Directory directory;
  string path;
  string fullPath;
  Directory local_b0;
  string *local_a8;
  long *local_a0;
  undefined8 local_98;
  long local_90 [2];
  string local_80;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  undefined8 local_50;
  char *local_48;
  undefined8 local_40;
  long *local_38;
  Status SVar5;
  
  cmsys::Directory::Directory(&local_b0);
  local_a8 = directoryPath;
  cmsys::Directory::Load(&local_b0,directoryPath,(string *)0x0);
  dindex = 0;
  do {
    uVar4 = cmsys::Directory::GetNumberOfFiles(&local_b0);
    if (uVar4 <= dindex) {
      SVar5 = cmsys::SystemTools::RemoveADirectory(local_a8);
      bVar1 = SVar5.Kind_ == Success;
LAB_001bd683:
      cmsys::Directory::~Directory(&local_b0);
      return bVar1;
    }
    __s = cmsys::Directory::GetFile(&local_b0,dindex);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,__s,(allocator<char> *)&local_60);
    iVar2 = std::__cxx11::string::compare((char *)&local_a0);
    bVar1 = false;
    if (((iVar2 != 0) && (iVar2 = std::__cxx11::string::compare((char *)&local_a0), iVar2 != 0)) &&
       (iVar2 = std::__cxx11::string::compare((char *)&local_a0), iVar2 != 0)) {
      local_60._M_str = (local_a8->_M_dataplus)._M_p;
      local_60._M_len = local_a8->_M_string_length;
      local_50 = 1;
      local_48 = "/";
      local_40 = local_98;
      local_38 = local_a0;
      views._M_len = 3;
      views._M_array = &local_60;
      cmCatViews_abi_cxx11_(&local_80,views);
      bVar1 = cmsys::SystemTools::FileIsDirectory(&local_80);
      if ((!bVar1) || (bVar1 = cmsys::SystemTools::FileIsSymlink(&local_80), bVar1)) {
        SVar5 = cmsys::SystemTools::RemoveFile(&local_80);
        KVar3 = SVar5.Kind_;
      }
      else {
        SVar5 = cmsys::SystemTools::RemoveADirectory(&local_80);
        KVar3 = SVar5.Kind_;
      }
      bVar1 = KVar3 != Success;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
    }
    if (local_a0 != local_90) {
      operator_delete(local_a0,local_90[0] + 1);
    }
    if (bVar1) {
      bVar1 = false;
      goto LAB_001bd683;
    }
    dindex = dindex + 1;
  } while( true );
}

Assistant:

bool cmCTestScriptHandler::TryToRemoveBinaryDirectoryOnce(
  const std::string& directoryPath)
{
  cmsys::Directory directory;
  directory.Load(directoryPath);

  for (unsigned long i = 0; i < directory.GetNumberOfFiles(); ++i) {
    std::string path = directory.GetFile(i);

    if (path == "." || path == ".." || path == "CMakeCache.txt") {
      continue;
    }

    std::string fullPath = cmStrCat(directoryPath, "/", path);

    bool isDirectory = cmSystemTools::FileIsDirectory(fullPath) &&
      !cmSystemTools::FileIsSymlink(fullPath);

    if (isDirectory) {
      if (!cmSystemTools::RemoveADirectory(fullPath)) {
        return false;
      }
    } else {
      if (!cmSystemTools::RemoveFile(fullPath)) {
        return false;
      }
    }
  }

  return static_cast<bool>(cmSystemTools::RemoveADirectory(directoryPath));
}